

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void move_right(int *angle,int *thrust,int vdistance,int dhs)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = HS;
  iVar1 = -0x16;
  if (dhs < HS) {
    iVar1 = 0;
  }
  iVar5 = 0xf;
  if (iVar1 - R < 0xf) {
    iVar5 = iVar1 - R;
  }
  iVar4 = -0xf;
  if (-0xf < iVar5) {
    iVar4 = iVar5;
  }
  *angle = iVar4 + R;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,R);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,*angle);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar1 = 4;
  if (dhs < iVar6) {
    iVar6 = 0;
    if (500 < vdistance) {
      iVar6 = -0x14;
    }
    iVar1 = (uint)(VS < iVar6) * 2 + 2;
  }
  *thrust = iVar1;
  return;
}

Assistant:

void move_right(int& angle, int& thrust, int vdistance, int dhs = 30)
{
    int desired = dhs < HS ? 0 : -TrueAngle;
    angle = R + std::max(std::min(desired - R, 15), -15);
    std::cerr << desired << "/" << R << "/" << angle << std::endl;
    if (0 != desired)
    {
        thrust = 4;
    }
    else
    {
        thrust = (500 < vdistance ? -20 : 0) > VS ? 4 : 2;
    }
}